

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

pair<bool,_cmValue> __thiscall
anon_unknown.dwarf_104bbf5::FileSetType::ReadProperties
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop)

{
  string_view sVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined8 extraout_RAX;
  pair<bool,_cmValue> pVar5;
  undefined1 local_288 [8];
  string fileSetName_1;
  undefined1 local_228 [8];
  string fileSetName;
  cmValue local_1e8;
  string_view local_1e0;
  size_t local_1d0;
  char *local_1c8;
  string local_1c0;
  size_t local_1a0;
  char *local_198;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_190;
  cmValue local_180;
  string_view local_178;
  size_t local_168;
  char *local_160;
  string local_158;
  size_t local_138;
  char *local_130;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_128;
  size_t local_118;
  char *pcStack_110;
  allocator<char> local_101;
  string local_100;
  string *local_e0;
  size_t local_d8;
  char *local_d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c8;
  size_t local_b8;
  char *pcStack_b0;
  allocator<char> local_91;
  string local_90;
  string *local_70;
  size_t local_68;
  char *local_60;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  cmValue local_48;
  cmValue value;
  bool did_read;
  string *prop_local;
  cmTargetInternals *impl_local;
  cmTarget *tgt_local;
  FileSetType *this_local;
  cmValue local_10;
  
  value.Value._7_1_ = 0;
  cmValue::cmValue(&local_48,(nullptr_t)0x0);
  local_58 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
  local_68 = (this->DefaultDirectoryProperty).super_string_view._M_len;
  local_60 = (this->DefaultDirectoryProperty).super_string_view._M_str;
  bVar2 = std::operator==(local_58,(this->DefaultDirectoryProperty).super_string_view);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_90,&this->TypeName,&local_91);
    local_b8 = (this->TypeName).super_string_view._M_len;
    pcStack_b0 = (this->TypeName).super_string_view._M_str;
    local_70 = (string *)
               cmTargetInternals::GetFileSetDirectories
                         (impl,tgt,&local_90,(this->TypeName).super_string_view);
    local_48 = (cmValue)local_70;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    value.Value._7_1_ = 1;
  }
  else {
    local_c8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
    local_d8 = (this->DefaultPathProperty).super_string_view._M_len;
    local_d0 = (this->DefaultPathProperty).super_string_view._M_str;
    bVar2 = std::operator==(local_c8,(this->DefaultPathProperty).super_string_view);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&local_100,&this->TypeName,&local_101);
      local_118 = (this->TypeName).super_string_view._M_len;
      pcStack_110 = (this->TypeName).super_string_view._M_str;
      local_e0 = (string *)
                 cmTargetInternals::GetFileSetPaths
                           (impl,tgt,&local_100,(this->TypeName).super_string_view);
      local_48 = (cmValue)local_e0;
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      value.Value._7_1_ = 1;
    }
    else {
      local_128 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
      local_138 = (this->SelfEntries).PropertyName.super_string_view._M_len;
      local_130 = (this->SelfEntries).PropertyName.super_string_view._M_str;
      bVar2 = std::operator==(local_128,(this->SelfEntries).PropertyName.super_string_view);
      if (bVar2) {
        if ((anonymous_namespace)::FileSetType::
            ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
            output_abi_cxx11_ == '\0') {
          iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::FileSetType::
                                       ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                                       ::output_abi_cxx11_);
          if (iVar3 != 0) {
            std::__cxx11::string::string
                      ((string *)
                       &(anonymous_namespace)::FileSetType::
                        ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                        ::output_abi_cxx11_);
            __cxa_atexit(std::__cxx11::string::~string,
                         &(anonymous_namespace)::FileSetType::
                          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                          ::output_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::FileSetType::
                                 ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                                 ::output_abi_cxx11_);
          }
        }
        local_178 = (string_view)::cm::operator____s(";",1);
        local_168 = local_178._M_len;
        local_160 = local_178._M_str;
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_158,&(this->SelfEntries).Entries,local_178);
        std::__cxx11::string::operator=
                  ((string *)
                   &(anonymous_namespace)::FileSetType::
                    ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                    ::output_abi_cxx11_,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        cmValue::cmValue(&local_180,
                         &(anonymous_namespace)::FileSetType::
                          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                          ::output_abi_cxx11_);
        local_48.Value = local_180.Value;
        value.Value._7_1_ = 1;
      }
      else {
        local_190 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
        local_1a0 = (this->InterfaceEntries).PropertyName.super_string_view._M_len;
        local_198 = (this->InterfaceEntries).PropertyName.super_string_view._M_str;
        bVar2 = std::operator==(local_190,(this->InterfaceEntries).PropertyName.super_string_view);
        if (bVar2) {
          if ((anonymous_namespace)::FileSetType::
              ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
              output_abi_cxx11_ == '\0') {
            iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::FileSetType::
                                         ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                                         ::output_abi_cxx11_);
            if (iVar3 != 0) {
              std::__cxx11::string::string
                        ((string *)
                         &(anonymous_namespace)::FileSetType::
                          ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                          ::output_abi_cxx11_);
              __cxa_atexit(std::__cxx11::string::~string,
                           &(anonymous_namespace)::FileSetType::
                            ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                            ::output_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&(anonymous_namespace)::FileSetType::
                                   ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                                   ::output_abi_cxx11_);
            }
          }
          local_1e0 = (string_view)::cm::operator____s(";",1);
          local_1d0 = local_1e0._M_len;
          local_1c8 = local_1e0._M_str;
          cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                    (&local_1c0,&(this->InterfaceEntries).Entries,local_1e0);
          std::__cxx11::string::operator=
                    ((string *)
                     &(anonymous_namespace)::FileSetType::
                      ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                      ::output_abi_cxx11_,(string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          cmValue::cmValue(&local_1e8,
                           &(anonymous_namespace)::FileSetType::
                            ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                            ::output_abi_cxx11_);
          local_48.Value = local_1e8.Value;
          value.Value._7_1_ = 1;
        }
        else {
          sVar1 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
          fileSetName.field_2._8_8_ = (this->DirectoryPrefix).super_string_view._M_len;
          bVar2 = cmHasPrefix(sVar1,(this->DirectoryPrefix).super_string_view);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::size
                      (&(this->DirectoryPrefix).super_string_view);
            std::__cxx11::string::substr((ulong)local_228,(ulong)prop);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              local_48 = cmTargetInternals::GetFileSetDirectories
                                   (impl,tgt,(string *)local_228,(this->TypeName).super_string_view)
              ;
            }
            value.Value._7_1_ = 1;
            std::__cxx11::string::~string((string *)local_228);
          }
          else {
            sVar1 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
            fileSetName_1.field_2._8_8_ = (this->PathPrefix).super_string_view._M_len;
            bVar2 = cmHasPrefix(sVar1,(this->PathPrefix).super_string_view);
            if (bVar2) {
              std::basic_string_view<char,_std::char_traits<char>_>::size
                        (&(this->PathPrefix).super_string_view);
              std::__cxx11::string::substr((ulong)local_288,(ulong)prop);
              uVar4 = std::__cxx11::string::empty();
              if ((uVar4 & 1) == 0) {
                local_48 = cmTargetInternals::GetFileSetPaths
                                     (impl,tgt,(string *)local_288,
                                      (this->TypeName).super_string_view);
              }
              value.Value._7_1_ = 1;
              std::__cxx11::string::~string((string *)local_288);
            }
          }
        }
      }
    }
  }
  std::pair<bool,_cmValue>::pair<bool_&,_cmValue_&,_true>
            ((pair<bool,_cmValue> *)&this_local,(bool *)((long)&value.Value + 7),&local_48);
  pVar5._1_7_ = (undefined7)((ulong)extraout_RAX >> 8);
  pVar5.first = (bool)this_local._0_1_;
  pVar5.second.Value = local_10.Value;
  return pVar5;
}

Assistant:

std::pair<bool, cmValue> FileSetType::ReadProperties(
  cmTarget const* tgt, cmTargetInternals const* impl,
  const std::string& prop) const
{
  bool did_read = false;
  cmValue value = nullptr;
  if (prop == this->DefaultDirectoryProperty) {
    value = impl->GetFileSetDirectories(tgt, std::string(this->TypeName),
                                        this->TypeName);
    did_read = true;
  } else if (prop == this->DefaultPathProperty) {
    value =
      impl->GetFileSetPaths(tgt, std::string(this->TypeName), this->TypeName);
    did_read = true;
  } else if (prop == this->SelfEntries.PropertyName) {
    static std::string output;
    output = cmJoin(this->SelfEntries.Entries, ";"_s);
    value = cmValue(output);
    did_read = true;
  } else if (prop == this->InterfaceEntries.PropertyName) {
    static std::string output;
    output = cmJoin(this->InterfaceEntries.Entries, ";"_s);
    value = cmValue(output);
    did_read = true;
  } else if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    std::string fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (!fileSetName.empty()) {
      value = impl->GetFileSetDirectories(tgt, fileSetName, this->TypeName);
    }
    did_read = true;
  } else if (cmHasPrefix(prop, this->PathPrefix)) {
    std::string fileSetName = prop.substr(this->PathPrefix.size());
    if (!fileSetName.empty()) {
      value = impl->GetFileSetPaths(tgt, fileSetName, this->TypeName);
    }
    did_read = true;
  }
  return { did_read, value };
}